

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution_x86::forward(Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  uint _c;
  size_t _elemsize;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  long *plVar7;
  void *pvVar8;
  Layer *pLVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar34;
  undefined8 uVar41;
  undefined8 uVar48;
  int j;
  Mat *this_00;
  ulong uVar49;
  ulong uVar50;
  int iVar51;
  code *pcVar52;
  void *pvVar53;
  int iVar54;
  int iVar55;
  code *pcVar56;
  ulong uVar57;
  void *pvVar58;
  ulong uVar59;
  void *pvVar60;
  int iVar61;
  void *pvVar62;
  Convolution *this_01;
  void *pvVar63;
  int i;
  uint uVar64;
  long lVar65;
  int iVar66;
  long lVar67;
  ulong uVar68;
  float (*pafVar69) [2];
  uint uVar70;
  int iVar71;
  long lVar72;
  undefined8 *puVar73;
  long lVar74;
  int p;
  long lVar75;
  ulong uVar76;
  long lVar77;
  int iVar78;
  long lVar79;
  float fVar80;
  float fVar81;
  Option opt_g;
  float w0 [4];
  float d3_1 [2];
  Mat top_blob_g;
  Option opt_g_1;
  Mat local_4d8;
  Mat bottom_blob_int8;
  float d3 [4];
  float d2 [4];
  size_t local_3d8;
  int local_3bc;
  float t1 [4];
  float t0 [4];
  size_t local_2c8;
  int local_2ac;
  float t3 [4];
  float t2 [4];
  float w3 [4];
  size_t local_208;
  int local_1ec;
  float w2 [4];
  size_t local_1c8;
  int local_1ac;
  float w1 [4];
  size_t local_188;
  int local_16c;
  undefined8 local_118;
  float o0 [2];
  Mat bottom_blob_unbordered;
  float sum3 [16];
  _Vector_base<float,_std::allocator<float>_> local_88;
  _Vector_base<float,_std::allocator<float>_> local_70;
  Option opt_b_3;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined3 uVar14;
  undefined1 uVar15;
  undefined2 uVar16;
  undefined1 uVar17;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined3 uVar22;
  undefined1 uVar23;
  undefined2 uVar24;
  undefined1 uVar25;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  undefined1 uVar35;
  undefined1 uVar36;
  undefined3 uVar37;
  undefined1 uVar38;
  undefined2 uVar39;
  undefined1 uVar40;
  undefined1 uVar42;
  undefined1 uVar43;
  undefined3 uVar44;
  undefined1 uVar45;
  undefined2 uVar46;
  undefined1 uVar47;
  
  this_01 = (Convolution *)
            ((long)&this->_vptr_Convolution_x86 + (long)this->_vptr_Convolution_x86[-3]);
  if (bottom_blob->dims != 3) {
LAB_0012286d:
    iVar54 = Convolution::forward(this_01,bottom_blob,top_blob,opt);
    return iVar54;
  }
  iVar54 = this_01->kernel_w;
  if (iVar54 != this_01->kernel_h) goto LAB_0012286d;
  iVar55 = this_01->stride_w;
  if (((iVar55 != this_01->stride_h) || (7 < iVar55 || 7 < iVar54)) ||
     (this_01->dilation_w != this_01->dilation_h)) goto LAB_0012286d;
  if (this_01->use_int8_inference == true) {
    lVar75 = (long)iVar54 + -1;
    lVar79 = (long)iVar55 + -1;
    if (this_01->use_int8_requantize == true) {
      pcVar52 = (code *)(&PTR_conv1x1s1_int8_requant_sse_0017cc90)[lVar75 * 4 + lVar79];
      pcVar56 = (code *)0x0;
    }
    else {
      pcVar56 = (code *)(&PTR_conv1x1s1_int8_dequant_sse_0017cbb0)[lVar75 * 4 + lVar79];
      pcVar52 = (code *)0x0;
    }
    if (pcVar52 == (code *)0x0 && pcVar56 == (code *)0x0) goto LAB_0012286d;
  }
  else {
    if (*(long *)((long)iVar54 * 0x20 + 0x17caa8 + (long)iVar55 * 8) == 0) goto LAB_0012286d;
    if (this_01->dilation_w != 1) {
      if (iVar55 == 1) {
        iVar54 = (*this->_vptr_Convolution_x86[3])(this,bottom_blob);
        return iVar54;
      }
      goto LAB_0012286d;
    }
    pcVar52 = (code *)0x0;
    pcVar56 = (code *)0x0;
  }
  iVar51 = bottom_blob->w;
  iVar71 = bottom_blob->h;
  iVar66 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if ((_elemsize != 1 & (&this->field_0x1c8)[(long)this->_vptr_Convolution_x86[-3]]) == 1) {
    bottom_blob_int8.elemsize._0_4_ = 0;
    bottom_blob_int8.elemsize._4_4_ = 0;
    bottom_blob_int8.elempack = 0;
    bottom_blob_int8.data = (void *)0x0;
    bottom_blob_int8.refcount._0_4_ = 0;
    bottom_blob_int8.refcount._4_4_ = 0;
    bottom_blob_int8.allocator = (Allocator *)0x0;
    bottom_blob_int8.dims = 0;
    bottom_blob_int8.w = 0;
    bottom_blob_int8.h = 0;
    bottom_blob_int8.c = 0;
    bottom_blob_int8.cstep = 0;
    Mat::create(&bottom_blob_int8,iVar51,iVar71,iVar66,1,opt->workspace_allocator);
    if ((bottom_blob_int8.data == (void *)0x0) ||
       ((long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0)) {
      Mat::~Mat(&bottom_blob_int8);
      iVar66 = -100;
      goto LAB_00124d03;
    }
    opt_g.lightmode = opt->lightmode;
    opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
    opt_g.num_threads = opt->num_threads;
    opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
    opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    opt_g.use_winograd_convolution = opt->use_winograd_convolution;
    opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_g.use_int8_inference = opt->use_int8_inference;
    opt_g.use_vulkan_compute = opt->use_vulkan_compute;
    opt_g.use_fp16_packed = opt->use_fp16_packed;
    opt_g.use_fp16_storage = opt->use_fp16_storage;
    opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_g.use_int8_storage = opt->use_int8_storage;
    opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_g.use_packing_layout = opt->use_packing_layout;
    opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
    opt_g.blob_allocator._0_4_ = SUB84(bottom_blob_int8.allocator,0);
    opt_g.blob_allocator._4_4_ = (undefined4)((ulong)bottom_blob_int8.allocator >> 0x20);
    (**(code **)(**(long **)(&this->field_0x1d0 + (long)this->_vptr_Convolution_x86[-3]) + 0x38))
              (*(long **)(&this->field_0x1d0 + (long)this->_vptr_Convolution_x86[-3]),bottom_blob);
    Mat::operator=(&bottom_blob_unbordered,&bottom_blob_int8);
    Mat::~Mat(&bottom_blob_int8);
  }
  local_4d8.data = bottom_blob_unbordered.data;
  local_4d8.refcount = bottom_blob_unbordered.refcount;
  local_4d8.elemsize = bottom_blob_unbordered.elemsize;
  local_4d8.elempack = bottom_blob_unbordered.elempack;
  local_4d8.allocator = bottom_blob_unbordered.allocator;
  local_4d8.dims = bottom_blob_unbordered.dims;
  local_4d8.w = bottom_blob_unbordered.w;
  local_4d8.h = bottom_blob_unbordered.h;
  local_4d8.c = bottom_blob_unbordered.c;
  local_4d8.cstep = bottom_blob_unbordered.cstep;
  if (bottom_blob_unbordered.refcount != (int *)0x0) {
    LOCK();
    *bottom_blob_unbordered.refcount = *bottom_blob_unbordered.refcount + 1;
    UNLOCK();
  }
  iVar66 = -100;
  pp_Var5 = this->_vptr_Convolution_x86;
  p_Var6 = pp_Var5[-3];
  iVar61 = *(int *)(p_Var6 + 4 +
                   (long)&(this->weight_3x3_winograd43_data).
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>);
  if (((iVar61 < 1) &&
      (iVar78 = *(int *)(p_Var6 + 8 +
                        (long)&(this->weight_3x3_winograd43_data).
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
      iVar78 < 1)) &&
     ((iVar3 = *(int *)(p_Var6 + 0xc +
                       (long)&(this->weight_3x3_winograd43_data).
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>), iVar3 < 1
      && (iVar4 = *(int *)(p_Var6 + 0x10 +
                          (long)&(this->weight_3x3_winograd43_data).
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
         iVar4 < 1)))) {
    if ((((iVar61 == -0xe9) && (iVar78 == -0xe9)) && (iVar3 == -0xe9)) && (iVar4 == -0xe9)) {
      iVar61 = ~((iVar51 + -1) % iVar55) + iVar54;
      iVar51 = ~((iVar71 + -1) % iVar55) + iVar54;
      if ((0 < iVar61) || (0 < iVar51)) {
        bottom_blob_int8.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        bottom_blob_int8.data = *(void **)opt;
        uVar34._0_1_ = opt->use_winograd_convolution;
        uVar34._1_1_ = opt->use_sgemm_convolution;
        uVar34._2_1_ = opt->use_int8_inference;
        uVar34._3_1_ = opt->use_vulkan_compute;
        uVar35 = opt->use_fp16_packed;
        uVar36 = opt->use_fp16_storage;
        uVar38 = opt->use_fp16_arithmetic;
        uVar40 = opt->use_int8_storage;
        uVar39 = CONCAT11(uVar40,uVar38);
        uVar37 = CONCAT21(uVar39,uVar36);
        uVar34._4_4_ = CONCAT31(uVar37,uVar35);
        bottom_blob_int8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8.elempack = (int)uVar34;
        bottom_blob_int8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8._28_4_ = uVar34._4_4_;
        copy_make_border(&bottom_blob_unbordered,&local_4d8,iVar51 / 2,iVar51 - iVar51 / 2,
                         iVar61 / 2,iVar61 - iVar61 / 2,0,
                         *(float *)(pp_Var5[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,(Option *)&bottom_blob_int8);
        if ((local_4d8.data == (void *)0x0) || ((long)local_4d8.c * local_4d8.cstep == 0))
        goto LAB_00124cf6;
      }
      iVar51 = local_4d8.w;
      iVar71 = local_4d8.h;
    }
    else if (((iVar61 == -0xea) && (iVar78 == -0xea)) && ((iVar3 == -0xea && (iVar4 == -0xea)))) {
      iVar61 = ~((iVar51 + -1) % iVar55) + iVar54;
      iVar51 = ~((iVar71 + -1) % iVar55) + iVar54;
      if ((0 < iVar61) || (0 < iVar51)) {
        bottom_blob_int8.allocator = *(Allocator **)&opt->use_int8_arithmetic;
        bottom_blob_int8.data = *(void **)opt;
        uVar41._0_1_ = opt->use_winograd_convolution;
        uVar41._1_1_ = opt->use_sgemm_convolution;
        uVar41._2_1_ = opt->use_int8_inference;
        uVar41._3_1_ = opt->use_vulkan_compute;
        uVar42 = opt->use_fp16_packed;
        uVar43 = opt->use_fp16_storage;
        uVar45 = opt->use_fp16_arithmetic;
        uVar47 = opt->use_int8_storage;
        uVar46 = CONCAT11(uVar47,uVar45);
        uVar44 = CONCAT21(uVar46,uVar43);
        uVar41._4_4_ = CONCAT31(uVar44,uVar42);
        bottom_blob_int8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8.elempack = (int)uVar41;
        bottom_blob_int8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
        bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        bottom_blob_int8._28_4_ = uVar41._4_4_;
        copy_make_border(&bottom_blob_unbordered,&local_4d8,iVar51 - iVar51 / 2,iVar51 / 2,
                         iVar61 - iVar61 / 2,iVar61 / 2,0,
                         *(float *)(pp_Var5[-3] + 0x14 +
                                   (long)&(this->weight_3x3_winograd43_data).
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                         ,(Option *)&bottom_blob_int8);
        goto LAB_0012260c;
      }
      goto LAB_00122635;
    }
LAB_00122648:
    iVar51 = (iVar51 - iVar54) / iVar55;
    iVar61 = iVar51 + 1;
    iVar55 = (iVar71 - iVar54) / iVar55;
    iVar54 = iVar55 + 1;
    p_Var6 = this->_vptr_Convolution_x86[-3];
    if ((&this->field_0x1c8)[(long)p_Var6] == '\x01') {
      if ((&this->field_0x1c9)[(long)p_Var6] == '\x01') {
        bottom_blob_int8.elemsize._0_4_ = 0;
        bottom_blob_int8.elemsize._4_4_ = 0;
        bottom_blob_int8.elempack = 0;
        bottom_blob_int8.data = (void *)0x0;
        bottom_blob_int8.refcount._0_4_ = 0;
        bottom_blob_int8.refcount._4_4_ = 0;
        bottom_blob_int8.allocator = (Allocator *)0x0;
        bottom_blob_int8.dims = 0;
        bottom_blob_int8.w = 0;
        bottom_blob_int8.h = 0;
        bottom_blob_int8.c = 0;
        bottom_blob_int8.cstep = 0;
        Mat::create(&bottom_blob_int8,iVar61,iVar54,
                    *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                            (long)&(this->weight_sgemm_data).data),4,opt->workspace_allocator);
        if (((bottom_blob_int8.data == (void *)0x0) ||
            ((long)bottom_blob_int8.c * bottom_blob_int8.cstep == 0)) ||
           ((Mat::create(top_blob,iVar61,iVar54,
                         *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                                 (long)&(this->weight_sgemm_data).data),1,opt->blob_allocator),
            top_blob->data == (void *)0x0 || ((long)top_blob->c * top_blob->cstep == 0)))) {
          Mat::~Mat(&bottom_blob_int8);
        }
        else {
          if (this->use_winograd3x3 == true) {
            conv3x3s1_winograd43_int8_sse
                      (&local_4d8,&bottom_blob_int8,&this->weight_3x3_winograd23_data,opt);
            for (lVar75 = 0;
                lVar75 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                                 (long)&(this->weight_sgemm_data).data); lVar75 = lVar75 + 1) {
              uVar18._0_1_ = opt->lightmode;
              uVar18._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar18._4_4_ = opt->num_threads;
              uVar19._0_1_ = opt->use_winograd_convolution;
              uVar19._1_1_ = opt->use_sgemm_convolution;
              uVar19._2_1_ = opt->use_int8_inference;
              uVar19._3_1_ = opt->use_vulkan_compute;
              uVar20 = opt->use_fp16_packed;
              uVar21 = opt->use_fp16_storage;
              uVar23 = opt->use_fp16_arithmetic;
              uVar25 = opt->use_int8_storage;
              uVar24 = CONCAT11(uVar25,uVar23);
              uVar22 = CONCAT21(uVar24,uVar21);
              uVar19._4_4_ = CONCAT31(uVar22,uVar20);
              opt_g_1.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g_1.use_packing_layout = opt->use_packing_layout;
              opt_g_1._34_6_ = *(undefined6 *)&opt->field_0x22;
              opt_g_1.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
              opt_g_1.workspace_allocator._4_4_ =
                   (undefined4)((ulong)opt->workspace_allocator >> 0x20);
              opt_g_1._24_4_ = SUB84(uVar19,0);
              opt_g_1._0_4_ = SUB84(uVar18,0);
              opt_g_1.num_threads = 1;
              opt_g_1.blob_allocator._0_4_ = SUB84(top_blob->allocator,0);
              opt_g_1.blob_allocator._4_4_ = (undefined4)((ulong)top_blob->allocator >> 0x20);
              opt_g_1._28_4_ = uVar19._4_4_;
              Mat::channel_range((Mat *)&opt_g,&bottom_blob_int8,(int)lVar75,1);
              Mat::channel_range(&top_blob_g,top_blob,(int)lVar75,1);
              plVar7 = *(long **)(*(long *)(&this->field_0x1f0 +
                                           (long)this->_vptr_Convolution_x86[-3]) + lVar75 * 8);
              (**(code **)(*plVar7 + 0x38))(plVar7,(Mat *)&opt_g,&top_blob_g,&opt_g_1);
              Mat::~Mat(&top_blob_g);
              Mat::~Mat((Mat *)&opt_g);
            }
          }
          else {
            p_Var6 = this->_vptr_Convolution_x86[-3];
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_70,
                       (vector<float,_std::allocator<float>_> *)(&this->field_0x220 + (long)p_Var6))
            ;
            (*pcVar52)(&local_4d8,top_blob,&this->field_0x100 + (long)p_Var6,
                       &this->field_0x140 + (long)p_Var6,&local_70,opt);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_70);
          }
          Mat::~Mat(&bottom_blob_int8);
LAB_00124ce1:
          pLVar9 = this->activation;
joined_r0x00124a00:
          if (pLVar9 != (Layer *)0x0) {
            (*pLVar9->_vptr_Layer[9])(pLVar9,top_blob,opt);
          }
          iVar66 = 0;
        }
      }
      else {
        Mat::create(top_blob,iVar61,iVar54,
                    *(int *)(p_Var6 + 0x28 + (long)&(this->weight_sgemm_data).data),4,
                    opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if (this->use_winograd3x3 == true) {
            conv3x3s1_winograd43_int8_sse(&local_4d8,top_blob,&this->weight_3x3_winograd23_data,opt)
            ;
            for (lVar75 = 0;
                lVar75 < *(int *)(this->_vptr_Convolution_x86[-3] + 0x28 +
                                 (long)&(this->weight_sgemm_data).data); lVar75 = lVar75 + 1) {
              uVar26._0_1_ = opt->lightmode;
              uVar26._1_3_ = *(undefined3 *)&opt->field_0x1;
              uVar26._4_4_ = opt->num_threads;
              uVar27._0_1_ = opt->use_winograd_convolution;
              uVar27._1_1_ = opt->use_sgemm_convolution;
              uVar27._2_1_ = opt->use_int8_inference;
              uVar27._3_1_ = opt->use_vulkan_compute;
              uVar28 = opt->use_fp16_packed;
              uVar29 = opt->use_fp16_storage;
              uVar31 = opt->use_fp16_arithmetic;
              uVar33 = opt->use_int8_storage;
              uVar32 = CONCAT11(uVar33,uVar31);
              uVar30 = CONCAT21(uVar32,uVar29);
              uVar27._4_4_ = CONCAT31(uVar30,uVar28);
              opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g.use_packing_layout = opt->use_packing_layout;
              opt_g._34_6_ = *(undefined6 *)&opt->field_0x22;
              opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
              opt_g.workspace_allocator._4_4_ =
                   (undefined4)((ulong)opt->workspace_allocator >> 0x20);
              opt_g._24_4_ = SUB84(uVar27,0);
              opt_g._0_4_ = SUB84(uVar26,0);
              opt_g.num_threads = 1;
              opt_g.blob_allocator._0_4_ = SUB84(top_blob->allocator,0);
              opt_g.blob_allocator._4_4_ = (undefined4)((ulong)top_blob->allocator >> 0x20);
              opt_g._28_4_ = uVar27._4_4_;
              Mat::channel_range(&bottom_blob_int8,top_blob,(int)lVar75,1);
              plVar7 = *(long **)(*(long *)(&this->field_0x1d8 +
                                           (long)this->_vptr_Convolution_x86[-3]) + lVar75 * 8);
              (**(code **)(*plVar7 + 0x48))(plVar7,&bottom_blob_int8,&opt_g);
              Mat::~Mat(&bottom_blob_int8);
            }
          }
          else {
            p_Var6 = this->_vptr_Convolution_x86[-3];
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_88,
                       (vector<float,_std::allocator<float>_> *)(&this->field_0x208 + (long)p_Var6))
            ;
            (*pcVar56)(&local_4d8,top_blob,&this->field_0x100 + (long)p_Var6,
                       &this->field_0x140 + (long)p_Var6,&local_88,opt);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_88);
          }
          goto LAB_00124ce1;
        }
      }
    }
    else {
      Mat::create(top_blob,iVar61,iVar54,
                  *(int *)(p_Var6 + 0x28 + (long)&(this->weight_sgemm_data).data),_elemsize,
                  opt->blob_allocator);
      if (top_blob->data != (void *)0x0) {
        _c = top_blob->c;
        uVar57 = (ulong)(int)_c;
        if (top_blob->cstep * uVar57 != 0) {
          p_Var6 = this->_vptr_Convolution_x86[-3];
          if (((this->use_winograd3x3 == true) && (6 < iVar51)) && (6 < iVar55)) {
            iVar66 = local_4d8.c;
            lVar75 = (long)local_4d8.c;
            iVar54 = top_blob->w;
            iVar55 = top_blob->h;
            bottom_blob_int8.data = local_4d8.data;
            bottom_blob_int8.refcount._0_4_ = SUB84(local_4d8.refcount,0);
            bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)local_4d8.refcount >> 0x20);
            bottom_blob_int8.elemsize._0_4_ = (undefined4)local_4d8.elemsize;
            bottom_blob_int8.elemsize._4_4_ = (undefined4)(local_4d8.elemsize >> 0x20);
            bottom_blob_int8.elempack = local_4d8.elempack;
            bottom_blob_int8.allocator = local_4d8.allocator;
            iVar51 = local_4d8.w;
            bottom_blob_int8.dims = local_4d8.dims;
            bottom_blob_int8.w = local_4d8.w;
            iVar71 = local_4d8.h;
            bottom_blob_int8.h = local_4d8.h;
            bottom_blob_int8.c = local_4d8.c;
            bottom_blob_int8.cstep = local_4d8.cstep;
            if (local_4d8.refcount != (int *)0x0) {
              LOCK();
              *local_4d8.refcount = *local_4d8.refcount + 1;
              UNLOCK();
            }
            uVar10 = (iVar54 + 1) / 2;
            uVar76 = (long)(iVar55 + 1) / 2;
            iVar54 = (int)uVar76;
            iVar61 = uVar10 * 2 + 2;
            opt_b_3.use_int8_arithmetic = opt->use_int8_arithmetic;
            opt_b_3.use_packing_layout = opt->use_packing_layout;
            opt_b_3._34_6_ = *(undefined6 *)&opt->field_0x22;
            opt_b_3.lightmode = opt->lightmode;
            opt_b_3._1_3_ = *(undefined3 *)&opt->field_0x1;
            opt_b_3.num_threads = opt->num_threads;
            opt_b_3.workspace_allocator = opt->workspace_allocator;
            opt_b_3.use_winograd_convolution = opt->use_winograd_convolution;
            opt_b_3.use_sgemm_convolution = opt->use_sgemm_convolution;
            opt_b_3.use_int8_inference = opt->use_int8_inference;
            opt_b_3.use_vulkan_compute = opt->use_vulkan_compute;
            opt_b_3.use_fp16_packed = opt->use_fp16_packed;
            opt_b_3.use_fp16_storage = opt->use_fp16_storage;
            opt_b_3.use_fp16_arithmetic = opt->use_fp16_arithmetic;
            opt_b_3.use_int8_storage = opt->use_int8_storage;
            opt_b_3.blob_allocator = opt->workspace_allocator;
            copy_make_border(&local_4d8,&bottom_blob_int8,0,(iVar54 * 2 - iVar71) + 2,0,
                             iVar61 - iVar51,0,0.0,&opt_b_3);
            pvVar8 = ((Mat *)(&this->field_0x140 + (long)p_Var6))->data;
            opt_g.workspace_allocator._0_4_ = 0;
            opt_g.workspace_allocator._4_4_ = 0;
            opt_g.use_winograd_convolution = false;
            opt_g.use_sgemm_convolution = false;
            opt_g.use_int8_inference = false;
            opt_g.use_vulkan_compute = false;
            opt_g.lightmode = false;
            opt_g._1_3_ = 0;
            opt_g.num_threads = 0;
            opt_g.blob_allocator._0_4_ = 0;
            opt_g.blob_allocator._4_4_ = 0;
            opt_g.use_int8_arithmetic = false;
            opt_g.use_packing_layout = false;
            opt_g._34_6_ = 0;
            iVar55 = iVar54 * uVar10;
            Mat::create((Mat *)&opt_g,0x10,iVar55,iVar66,4,opt->workspace_allocator);
            this_00 = &this->weight_3x3_winograd23_data;
            lVar79 = (long)iVar61;
            uVar59 = 0;
            uVar70 = 0;
            if (0 < (int)uVar10) {
              uVar70 = uVar10;
            }
            uVar76 = uVar76 & 0xffffffff;
            if (iVar54 < 1) {
              uVar76 = uVar59;
            }
            uVar49 = 0;
            if (0 < iVar66) {
              uVar49 = (ulong)(uint)iVar66;
            }
            for (; uVar59 != uVar49; uVar59 = uVar59 + 1) {
              pvVar60 = (void *)(bottom_blob_int8.cstep * uVar59 *
                                 CONCAT44(bottom_blob_int8.elemsize._4_4_,
                                          (undefined4)bottom_blob_int8.elemsize) +
                                (long)bottom_blob_int8.data);
              top_blob_g.refcount._0_4_ = 0;
              top_blob_g.refcount._4_4_ = 0;
              top_blob_g.elemsize._0_4_ = (undefined4)bottom_blob_int8.elemsize;
              top_blob_g.elemsize._4_4_ = bottom_blob_int8.elemsize._4_4_;
              top_blob_g.elempack = bottom_blob_int8.elempack;
              top_blob_g.allocator = bottom_blob_int8.allocator;
              top_blob_g.w = bottom_blob_int8.w;
              top_blob_g.dims = 2;
              top_blob_g.c = 1;
              top_blob_g.h = bottom_blob_int8.h;
              top_blob_g.cstep = (size_t)(bottom_blob_int8.h * bottom_blob_int8.w);
              top_blob_g.data = pvVar60;
              Mat::~Mat(&top_blob_g);
              lVar77 = opt_g._0_8_;
              top_blob_g.data = (void *)opt_g._0_8_;
              top_blob_g.refcount._0_4_ = 0;
              top_blob_g.refcount._4_4_ = 0;
              top_blob_g.elemsize._0_4_ = opt_g.workspace_allocator._0_4_;
              top_blob_g.elemsize._4_4_ = opt_g.workspace_allocator._4_4_;
              top_blob_g.elempack._0_1_ = opt_g.use_winograd_convolution;
              top_blob_g.elempack._1_1_ = opt_g.use_sgemm_convolution;
              top_blob_g.elempack._2_1_ = opt_g.use_int8_inference;
              top_blob_g.elempack._3_1_ = opt_g.use_vulkan_compute;
              top_blob_g.allocator = (Allocator *)opt_g._32_8_;
              top_blob_g.dims = 2;
              top_blob_g.w = 0;
              top_blob_g.h = 0;
              top_blob_g.c = 1;
              top_blob_g.cstep = 0;
              Mat::~Mat(&top_blob_g);
              for (uVar50 = 0; uVar50 != uVar76; uVar50 = uVar50 + 1) {
                pvVar53 = (void *)((long)(iVar61 * 2 * (int)uVar50) * 4 + (long)pvVar60);
                pvVar58 = (void *)((long)pvVar53 + lVar79 * 4);
                pvVar62 = (void *)((long)pvVar58 + lVar79 * 4);
                pvVar63 = (void *)((long)pvVar62 + lVar79 * 4);
                for (uVar64 = 0; uVar64 != uVar70; uVar64 = uVar64 + 1) {
                  for (lVar67 = 0; lVar67 != 0x10; lVar67 = lVar67 + 4) {
                    *(undefined4 *)((long)&top_blob_g.data + lVar67) =
                         *(undefined4 *)((long)pvVar53 + lVar67);
                    *(undefined4 *)(&opt_g_1.lightmode + lVar67) =
                         *(undefined4 *)((long)pvVar58 + lVar67);
                    *(undefined4 *)((long)d2 + lVar67) = *(undefined4 *)((long)pvVar62 + lVar67);
                    *(undefined4 *)((long)d3 + lVar67) = *(undefined4 *)((long)pvVar63 + lVar67);
                  }
                  for (lVar67 = 0; lVar67 != 0x10; lVar67 = lVar67 + 4) {
                    fVar80 = *(float *)((long)d2 + lVar67);
                    *(float *)((long)w0 + lVar67) =
                         *(float *)((long)&top_blob_g.data + lVar67) - fVar80;
                    fVar81 = *(float *)(&opt_g_1.lightmode + lVar67);
                    *(float *)((long)w1 + lVar67) = fVar81 + fVar80;
                    *(float *)((long)w2 + lVar67) = fVar80 - fVar81;
                    *(float *)((long)w3 + lVar67) = *(float *)((long)d3 + lVar67) - fVar81;
                  }
                  t0[0] = w0[0];
                  t0[1] = w1[0];
                  t1[1] = w1[1];
                  t1[0] = w0[1];
                  t2[0] = (float)w0._8_8_;
                  t2[1] = w1[2];
                  t3[1] = w1[3];
                  t3[0] = w0[3];
                  t0[2] = w2[0];
                  t0[3] = w3[0];
                  t1[3] = w3[1];
                  t1[2] = w2[1];
                  t2[3] = w3[2];
                  t2[2] = w2[2];
                  t3[3] = w3[3];
                  t3[2] = w2[3];
                  for (lVar67 = 0; lVar67 != 0x10; lVar67 = lVar67 + 4) {
                    fVar80 = *(float *)((long)t2 + lVar67);
                    *(float *)((long)&top_blob_g.data + lVar67) =
                         *(float *)((long)t0 + lVar67) - fVar80;
                    fVar81 = *(float *)((long)t1 + lVar67);
                    *(float *)(&opt_g_1.lightmode + lVar67) = fVar81 + fVar80;
                    *(float *)((long)d2 + lVar67) = fVar80 - fVar81;
                    *(float *)((long)d3 + lVar67) = *(float *)((long)t3 + lVar67) - fVar81;
                  }
                  for (lVar67 = 0; lVar67 != 0x10; lVar67 = lVar67 + 4) {
                    *(undefined4 *)(lVar77 + lVar67) =
                         *(undefined4 *)((long)&top_blob_g.data + lVar67);
                    *(undefined4 *)(lVar77 + 0x10 + lVar67) =
                         *(undefined4 *)(&opt_g_1.lightmode + lVar67);
                    *(undefined4 *)(lVar77 + 0x20 + lVar67) = *(undefined4 *)((long)d2 + lVar67);
                    *(undefined4 *)(lVar77 + 0x30 + lVar67) = *(undefined4 *)((long)d3 + lVar67);
                  }
                  pvVar53 = (void *)((long)pvVar53 + 8);
                  pvVar58 = (void *)((long)pvVar58 + 8);
                  pvVar62 = (void *)((long)pvVar62 + 8);
                  pvVar63 = (void *)((long)pvVar63 + 8);
                  lVar77 = lVar77 + 0x40;
                }
              }
            }
            top_blob_g.elemsize._0_4_ = 0;
            top_blob_g.elemsize._4_4_ = 0;
            top_blob_g.elempack = 0;
            top_blob_g.data = (void *)0x0;
            top_blob_g.refcount._0_4_ = 0;
            top_blob_g.refcount._4_4_ = 0;
            top_blob_g.allocator = (Allocator *)0x0;
            top_blob_g.dims = 0;
            top_blob_g.w = 0;
            top_blob_g.h = 0;
            top_blob_g.c = 0;
            top_blob_g.cstep = 0;
            Mat::operator=(&bottom_blob_int8,&top_blob_g);
            Mat::~Mat(&top_blob_g);
            top_blob_g.elemsize._0_4_ = 0;
            top_blob_g.elemsize._4_4_ = 0;
            top_blob_g.elempack = 0;
            top_blob_g.data = (void *)0x0;
            top_blob_g.refcount._0_4_ = 0;
            top_blob_g.refcount._4_4_ = 0;
            top_blob_g.allocator = (Allocator *)0x0;
            top_blob_g.dims = 0;
            top_blob_g.w = 0;
            top_blob_g.h = 0;
            top_blob_g.c = 0;
            top_blob_g.cstep = 0;
            Mat::create(&top_blob_g,0x10,iVar55,_c,4,opt->workspace_allocator);
            uVar59 = uVar57 & 0xfffffffffffffffc;
            uVar49 = 0;
            if (iVar55 < 1) {
              iVar55 = 0;
            }
            uVar50 = (ulong)(uint)((int)_c >> 2);
            if ((int)_c >> 2 < 1) {
              uVar50 = uVar49;
            }
            for (; uVar49 != uVar50; uVar49 = uVar49 + 1) {
              iVar51 = top_blob_g.w;
              local_3d8 = CONCAT44(top_blob_g.elemsize._4_4_,(undefined4)top_blob_g.elemsize);
              lVar65 = top_blob_g.cstep * local_3d8;
              opt_g_1._0_8_ = lVar65 * uVar49 * 4 + (long)top_blob_g.data;
              opt_g_1.blob_allocator._0_4_ = 0;
              opt_g_1.blob_allocator._4_4_ = 0;
              opt_g_1.workspace_allocator._0_4_ = (undefined4)top_blob_g.elemsize;
              opt_g_1.workspace_allocator._4_4_ = top_blob_g.elemsize._4_4_;
              opt_g_1.use_winograd_convolution = (bool)(undefined1)top_blob_g.elempack;
              opt_g_1.use_sgemm_convolution = (bool)top_blob_g.elempack._1_1_;
              opt_g_1.use_int8_inference = (bool)top_blob_g.elempack._2_1_;
              opt_g_1.use_vulkan_compute = (bool)top_blob_g.elempack._3_1_;
              opt_g_1._32_8_ = top_blob_g.allocator;
              lVar79 = uVar49 * 4 + 1;
              d2._0_8_ = lVar65 * lVar79 + (long)top_blob_g.data;
              d2[2] = 0.0;
              d2[3] = 0.0;
              local_3bc = top_blob_g.w;
              lVar77 = uVar49 * 4 + 2;
              d3._0_8_ = lVar65 * lVar77 + (long)top_blob_g.data;
              d3[2] = 0.0;
              d3[3] = 0.0;
              lVar67 = uVar49 * 4 + 3;
              w0._0_8_ = lVar65 * lVar67 + (long)top_blob_g.data;
              w0[2] = 0.0;
              w0[3] = 0.0;
              Mat::channel((Mat *)w1,this_00,(int)(uVar49 * 4));
              Mat::channel((Mat *)w2,this_00,(int)lVar79);
              Mat::channel((Mat *)w3,this_00,(int)lVar77);
              Mat::channel((Mat *)t0,this_00,(int)lVar67);
              for (iVar71 = 0; uVar26 = d2._0_8_, uVar34 = d3._0_8_, uVar41 = opt_g_1._0_8_,
                  uVar11 = w0._0_8_, iVar71 != iVar55; iVar71 = iVar71 + 1) {
                lVar79 = CONCAT44(opt_g_1.workspace_allocator._4_4_,
                                  opt_g_1.workspace_allocator._0_4_);
                t1[0] = 0.0;
                t1[1] = 0.0;
                t1[2] = 0.0;
                t1[3] = 0.0;
                t2[0] = 0.0;
                t2[1] = 0.0;
                t2[2] = 0.0;
                t2[3] = 0.0;
                t3[0] = 0.0;
                t3[1] = 0.0;
                t3[2] = 0.0;
                t3[3] = 0.0;
                sum3[0xc] = 0.0;
                sum3[0xd] = 0.0;
                sum3[0xe] = 0.0;
                sum3[0xf] = 0.0;
                sum3[8] = 0.0;
                sum3[9] = 0.0;
                sum3[10] = 0.0;
                sum3[0xb] = 0.0;
                sum3[4] = 0.0;
                sum3[5] = 0.0;
                sum3[6] = 0.0;
                sum3[7] = 0.0;
                sum3[0] = 0.0;
                sum3[1] = 0.0;
                sum3[2] = 0.0;
                sum3[3] = 0.0;
                for (uVar68 = 0; uVar27 = opt_g._0_8_, (long)(uVar68 | 3) < lVar75;
                    uVar68 = uVar68 + 4) {
                  d3_1 = (float  [2])opt_g._0_8_;
                  Mat::~Mat((Mat *)d3_1);
                  uVar18 = opt_g._0_8_;
                  d3_1 = (float  [2])opt_g._0_8_;
                  Mat::~Mat((Mat *)d3_1);
                  uVar19 = opt_g._0_8_;
                  d3_1 = (float  [2])opt_g._0_8_;
                  Mat::~Mat((Mat *)d3_1);
                  uVar48 = opt_g._0_8_;
                  d3_1 = (float  [2])opt_g._0_8_;
                  Mat::~Mat((Mat *)d3_1);
                  iVar66 = (int)uVar68;
                  lVar77 = (long)(local_2ac * iVar66) * local_2c8 + CONCAT44(t0[1],t0[0]);
                  lVar67 = (long)(local_1ec * iVar66) * local_208 + CONCAT44(w3[1],w3[0]);
                  lVar65 = (long)(local_1ac * iVar66) * local_1c8 + CONCAT44(w2[1],w2[0]);
                  lVar72 = (long)(local_16c * iVar66) * local_188 + CONCAT44(w1[1],w1[0]);
                  for (lVar74 = 0; lVar74 != 0x40; lVar74 = lVar74 + 4) {
                    fVar80 = *(float *)(uVar48 + lVar74);
                    fVar81 = *(float *)(uVar19 + lVar74);
                    fVar1 = *(float *)(uVar18 + lVar74);
                    fVar2 = *(float *)(uVar27 + lVar74);
                    *(float *)((long)t1 + lVar74) =
                         *(float *)(lVar72 + 0xc0 + lVar74) * fVar80 +
                         *(float *)(lVar72 + 0x40 + lVar74) * fVar1 +
                         *(float *)(lVar72 + 0x80 + lVar74) * fVar81 +
                         *(float *)(lVar72 + lVar74) * fVar2 + *(float *)((long)t1 + lVar74);
                    *(float *)((long)t2 + lVar74) =
                         *(float *)(lVar65 + 0xc0 + lVar74) * fVar80 +
                         *(float *)(lVar65 + 0x40 + lVar74) * fVar1 +
                         *(float *)(lVar65 + 0x80 + lVar74) * fVar81 +
                         *(float *)(lVar65 + lVar74) * fVar2 + *(float *)((long)t2 + lVar74);
                    *(float *)((long)t3 + lVar74) =
                         *(float *)(lVar67 + 0xc0 + lVar74) * fVar80 +
                         *(float *)(lVar67 + 0x40 + lVar74) * fVar1 +
                         *(float *)(lVar67 + 0x80 + lVar74) * fVar81 +
                         *(float *)(lVar67 + lVar74) * fVar2 + *(float *)((long)t3 + lVar74);
                    *(float *)((long)sum3 + lVar74) =
                         *(float *)(lVar77 + 0xc0 + lVar74) * fVar80 +
                         *(float *)(lVar77 + 0x40 + lVar74) * fVar1 +
                         *(float *)(lVar77 + 0x80 + lVar74) * fVar81 +
                         *(float *)(lVar77 + lVar74) * fVar2 + *(float *)((long)sum3 + lVar74);
                  }
                }
                for (; uVar27 = opt_g._0_8_, (long)uVar68 < lVar75; uVar68 = uVar68 + 1) {
                  d3_1 = (float  [2])opt_g._0_8_;
                  Mat::~Mat((Mat *)d3_1);
                  iVar66 = (int)uVar68;
                  lVar77 = CONCAT44(t0[1],t0[0]);
                  lVar67 = CONCAT44(w3[1],w3[0]);
                  for (lVar65 = 0; lVar65 != 0x40; lVar65 = lVar65 + 4) {
                    fVar80 = *(float *)(uVar27 + lVar65);
                    *(float *)((long)t1 + lVar65) =
                         *(float *)((long)(local_16c * iVar66) * local_188 + CONCAT44(w1[1],w1[0]) +
                                   lVar65) * fVar80 + *(float *)((long)t1 + lVar65);
                    *(float *)((long)t2 + lVar65) =
                         *(float *)((long)(local_1ac * iVar66) * local_1c8 + CONCAT44(w2[1],w2[0]) +
                                   lVar65) * fVar80 + *(float *)((long)t2 + lVar65);
                    *(float *)((long)t3 + lVar65) =
                         *(float *)((long)(local_1ec * iVar66) * local_208 + lVar67 + lVar65) *
                         fVar80 + *(float *)((long)t3 + lVar65);
                    *(float *)((long)sum3 + lVar65) =
                         fVar80 * *(float *)((long)(local_2ac * iVar66) * local_2c8 + lVar77 +
                                            lVar65) + *(float *)((long)sum3 + lVar65);
                  }
                }
                for (lVar77 = 0; lVar77 != 0x40; lVar77 = lVar77 + 4) {
                  *(undefined4 *)(uVar41 + lVar79 * (iVar51 * iVar71) + lVar77) =
                       *(undefined4 *)((long)t1 + lVar77);
                  *(undefined4 *)(uVar26 + local_3d8 * (long)(iVar51 * iVar71) + lVar77) =
                       *(undefined4 *)((long)t2 + lVar77);
                  *(undefined4 *)(uVar34 + local_3d8 * (long)(iVar51 * iVar71) + lVar77) =
                       *(undefined4 *)((long)t3 + lVar77);
                  *(undefined4 *)(uVar11 + local_3d8 * (long)(iVar51 * iVar71) + lVar77) =
                       *(undefined4 *)((long)sum3 + lVar77);
                }
              }
              Mat::~Mat((Mat *)t0);
              Mat::~Mat((Mat *)w3);
              Mat::~Mat((Mat *)w2);
              Mat::~Mat((Mat *)w1);
              Mat::~Mat((Mat *)w0);
              Mat::~Mat((Mat *)d3);
              Mat::~Mat((Mat *)d2);
              Mat::~Mat((Mat *)&opt_g_1);
            }
            for (; (long)uVar59 < (long)uVar57; uVar59 = uVar59 + 1) {
              iVar51 = top_blob_g.w;
              opt_g_1._0_8_ =
                   top_blob_g.cstep * uVar59 *
                   CONCAT44(top_blob_g.elemsize._4_4_,(undefined4)top_blob_g.elemsize) +
                   (long)top_blob_g.data;
              opt_g_1.blob_allocator._0_4_ = 0;
              opt_g_1.blob_allocator._4_4_ = 0;
              opt_g_1.workspace_allocator._0_4_ = (undefined4)top_blob_g.elemsize;
              opt_g_1.workspace_allocator._4_4_ = top_blob_g.elemsize._4_4_;
              opt_g_1.use_winograd_convolution = (bool)(undefined1)top_blob_g.elempack;
              opt_g_1.use_sgemm_convolution = (bool)top_blob_g.elempack._1_1_;
              opt_g_1.use_int8_inference = (bool)top_blob_g.elempack._2_1_;
              opt_g_1.use_vulkan_compute = (bool)top_blob_g.elempack._3_1_;
              opt_g_1._32_8_ = top_blob_g.allocator;
              Mat::channel((Mat *)d2,this_00,(int)uVar59);
              for (iVar71 = 0; uVar11 = opt_g_1._0_8_, iVar71 != iVar55; iVar71 = iVar71 + 1) {
                lVar79 = CONCAT44(opt_g_1.workspace_allocator._4_4_,
                                  opt_g_1.workspace_allocator._0_4_);
                d3[0] = 0.0;
                d3[1] = 0.0;
                d3[2] = 0.0;
                d3[3] = 0.0;
                iVar61 = 1;
                iVar66 = 2;
                iVar78 = 3;
                for (uVar49 = 0; uVar41 = opt_g._0_8_, (long)(uVar49 | 3) < lVar75;
                    uVar49 = uVar49 + 4) {
                  w0[0]._0_1_ = opt_g.lightmode;
                  w0[0]._1_3_ = opt_g._1_3_;
                  w0[1] = (float)opt_g.num_threads;
                  w0[2] = 0.0;
                  w0[3] = 0.0;
                  Mat::~Mat((Mat *)w0);
                  uVar34 = opt_g._0_8_;
                  w0[0]._0_1_ = opt_g.lightmode;
                  w0[0]._1_3_ = opt_g._1_3_;
                  w0[1] = (float)opt_g.num_threads;
                  w0[2] = 0.0;
                  w0[3] = 0.0;
                  Mat::~Mat((Mat *)w0);
                  uVar26 = opt_g._0_8_;
                  w0[0]._0_1_ = opt_g.lightmode;
                  w0[0]._1_3_ = opt_g._1_3_;
                  w0[1] = (float)opt_g.num_threads;
                  w0[2] = 0.0;
                  w0[3] = 0.0;
                  Mat::~Mat((Mat *)w0);
                  uVar27 = opt_g._0_8_;
                  w0[0]._0_1_ = opt_g.lightmode;
                  w0[0]._1_3_ = opt_g._1_3_;
                  w0[1] = (float)opt_g.num_threads;
                  w0[2] = 0.0;
                  w0[3] = 0.0;
                  Mat::~Mat((Mat *)w0);
                  lVar77 = (long)(local_3bc * iVar78) * local_3d8 + d2._0_8_;
                  lVar67 = (long)(iVar66 * local_3bc) * local_3d8 + d2._0_8_;
                  lVar65 = (long)(iVar61 * local_3bc) * local_3d8 + d2._0_8_;
                  lVar72 = (long)((int)uVar49 * local_3bc) * local_3d8 + d2._0_8_;
                  for (lVar74 = 0; lVar74 != 0x40; lVar74 = lVar74 + 4) {
                    *(float *)((long)d3 + lVar74) =
                         *(float *)(uVar27 + lVar74) * *(float *)(lVar77 + lVar74) +
                         *(float *)(uVar34 + lVar74) * *(float *)(lVar65 + lVar74) +
                         *(float *)(uVar26 + lVar74) * *(float *)(lVar67 + lVar74) +
                         *(float *)(uVar41 + lVar74) * *(float *)(lVar72 + lVar74) +
                         *(float *)((long)d3 + lVar74);
                  }
                  iVar78 = iVar78 + 4;
                  iVar66 = iVar66 + 4;
                  iVar61 = iVar61 + 4;
                }
                for (; uVar41 = opt_g._0_8_, (long)uVar49 < lVar75; uVar49 = uVar49 + 1) {
                  w0[0]._0_1_ = opt_g.lightmode;
                  w0[0]._1_3_ = opt_g._1_3_;
                  w0[1] = (float)opt_g.num_threads;
                  w0[2] = 0.0;
                  w0[3] = 0.0;
                  Mat::~Mat((Mat *)w0);
                  for (lVar77 = 0; lVar77 != 0x10; lVar77 = lVar77 + 1) {
                    d3[lVar77] = *(float *)((long)(local_3bc * (int)uVar49) * local_3d8 + d2._0_8_ +
                                           lVar77 * 4) * *(float *)(uVar41 + lVar77 * 4) +
                                 d3[lVar77];
                  }
                }
                for (lVar77 = 0; lVar77 != 0x10; lVar77 = lVar77 + 1) {
                  *(float *)(uVar11 + lVar79 * (iVar51 * iVar71) + lVar77 * 4) = d3[lVar77];
                }
              }
              Mat::~Mat((Mat *)d2);
              Mat::~Mat((Mat *)&opt_g_1);
            }
            opt_g_1.workspace_allocator._0_4_ = 0;
            opt_g_1.workspace_allocator._4_4_ = 0;
            opt_g_1.use_winograd_convolution = false;
            opt_g_1.use_sgemm_convolution = false;
            opt_g_1.use_int8_inference = false;
            opt_g_1.use_vulkan_compute = false;
            opt_g_1.lightmode = false;
            opt_g_1._1_3_ = 0;
            opt_g_1.num_threads = 0;
            opt_g_1.blob_allocator._0_4_ = 0;
            opt_g_1.blob_allocator._4_4_ = 0;
            opt_g_1.use_int8_arithmetic = false;
            opt_g_1.use_packing_layout = false;
            opt_g_1._34_6_ = 0;
            Mat::operator=((Mat *)&opt_g,(Mat *)&opt_g_1);
            Mat::~Mat((Mat *)&opt_g_1);
            opt_g_1.workspace_allocator._0_4_ = 0;
            opt_g_1.workspace_allocator._4_4_ = 0;
            opt_g_1.use_winograd_convolution = false;
            opt_g_1.use_sgemm_convolution = false;
            opt_g_1.use_int8_inference = false;
            opt_g_1.use_vulkan_compute = false;
            opt_g_1.lightmode = false;
            opt_g_1._1_3_ = 0;
            opt_g_1.num_threads = 0;
            opt_g_1.blob_allocator._0_4_ = 0;
            opt_g_1.blob_allocator._4_4_ = 0;
            opt_g_1.use_int8_arithmetic = false;
            opt_g_1.use_packing_layout = false;
            opt_g_1._34_6_ = 0;
            Mat::create((Mat *)&opt_g_1,uVar10 * 2,iVar54 * 2,_c,4,opt->workspace_allocator);
            uVar59 = 0;
            uVar57 = (ulong)_c;
            if ((int)_c < 1) {
              uVar57 = uVar59;
            }
            for (; uVar11 = opt_g_1._0_8_, uVar59 != uVar57; uVar59 = uVar59 + 1) {
              lVar79 = (long)top_blob_g.w;
              lVar75 = CONCAT44(top_blob_g.elemsize._4_4_,(undefined4)top_blob_g.elemsize);
              d2._0_8_ = (void *)(top_blob_g.cstep * uVar59 * lVar75 + (long)top_blob_g.data);
              d2[2] = 0.0;
              d2[3] = 0.0;
              d3[2] = 0.0;
              d3[3] = 0.0;
              d3._0_8_ = opt_g_1._0_8_;
              if (pvVar8 == (void *)0x0) {
                fVar80 = 0.0;
              }
              else {
                fVar80 = *(float *)((long)pvVar8 + uVar59 * 4);
              }
              lVar77 = (long)top_blob_g.data + top_blob_g.cstep * lVar75 * uVar59 + 0x30;
              for (uVar49 = 0; uVar49 != uVar76; uVar49 = uVar49 + 1) {
                pafVar69 = (float (*) [2])uVar11;
                puVar73 = (undefined8 *)uVar11;
                lVar67 = lVar77;
                for (uVar50 = 0; uVar50 != uVar70; uVar50 = uVar50 + 1) {
                  for (lVar65 = 0; lVar65 != 0x10; lVar65 = lVar65 + 4) {
                    *(undefined4 *)((long)w0 + lVar65) = *(undefined4 *)(lVar67 + -0x30 + lVar65);
                    *(undefined4 *)((long)w1 + lVar65) = *(undefined4 *)(lVar67 + -0x20 + lVar65);
                    *(undefined4 *)((long)w2 + lVar65) = *(undefined4 *)(lVar67 + -0x10 + lVar65);
                    *(undefined4 *)((long)w3 + lVar65) = *(undefined4 *)(lVar67 + lVar65);
                  }
                  for (lVar65 = 0; lVar65 != 0x10; lVar65 = lVar65 + 4) {
                    *(float *)((long)t0 + lVar65) =
                         *(float *)((long)w0 + lVar65) + *(float *)((long)w1 + lVar65) +
                         *(float *)((long)w2 + lVar65);
                    *(float *)((long)t1 + lVar65) =
                         (*(float *)((long)w1 + lVar65) - *(float *)((long)w2 + lVar65)) +
                         *(float *)((long)w3 + lVar65);
                  }
                  t2[1] = t1[0];
                  t2[0] = t0[0];
                  t3[1] = t1[1];
                  t3[0] = t0[1];
                  sum3[1] = t1[2];
                  sum3[0] = t0[2];
                  d3_1[1] = t1[3];
                  d3_1[0] = t0[3];
                  for (lVar65 = 0; lVar65 != 8; lVar65 = lVar65 + 4) {
                    fVar81 = *(float *)((long)t3 + lVar65) + fVar80;
                    *(float *)((long)o0 + lVar65) =
                         *(float *)((long)t2 + lVar65) + fVar81 + *(float *)((long)sum3 + lVar65);
                    *(float *)((long)o0 + lVar65 + -8) =
                         (fVar81 - *(float *)((long)sum3 + lVar65)) +
                         *(float *)((long)d3_1 + lVar65);
                  }
                  *pafVar69 = o0;
                  *puVar73 = local_118;
                  pafVar69 = pafVar69 + 1;
                  puVar73 = puVar73 + 1;
                  lVar67 = lVar67 + lVar79 * lVar75;
                }
                lVar77 = lVar77 + lVar79 * lVar75 * (long)(int)uVar10;
              }
              Mat::~Mat((Mat *)d3);
              Mat::~Mat((Mat *)d2);
            }
            copy_cut_border((Mat *)&opt_g_1,top_blob,0,-top_blob->h,0,-top_blob->w,opt);
            Mat::~Mat((Mat *)&opt_g_1);
            Mat::~Mat(&top_blob_g);
            Mat::~Mat((Mat *)&opt_g);
            Mat::~Mat(&bottom_blob_int8);
          }
          else {
            conv_im2col_sgemm_sse
                      (&local_4d8,top_blob,&this->weight_sgemm_data,
                       (Mat *)(&this->field_0x140 + (long)p_Var6),
                       *(int *)(p_Var6 + 0x2c + (long)&(this->weight_sgemm_data).data),
                       *(int *)(p_Var6 + 0x30 + (long)&(this->weight_sgemm_data).data),
                       *(int *)(p_Var6 + 0x3c + (long)&(this->weight_sgemm_data).data),
                       *(int *)(p_Var6 + (long)&(this->weight_3x3_winograd43_data).
                                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                               ),opt);
          }
          pLVar9 = this->activation;
          goto joined_r0x00124a00;
        }
      }
    }
  }
  else {
    bottom_blob_int8.allocator = *(Allocator **)&opt->use_int8_arithmetic;
    bottom_blob_int8.data = *(void **)opt;
    uVar11._0_1_ = opt->use_winograd_convolution;
    uVar11._1_1_ = opt->use_sgemm_convolution;
    uVar11._2_1_ = opt->use_int8_inference;
    uVar11._3_1_ = opt->use_vulkan_compute;
    uVar12 = opt->use_fp16_packed;
    uVar13 = opt->use_fp16_storage;
    uVar15 = opt->use_fp16_arithmetic;
    uVar17 = opt->use_int8_storage;
    uVar16 = CONCAT11(uVar17,uVar15);
    uVar14 = CONCAT21(uVar16,uVar13);
    uVar11._4_4_ = CONCAT31(uVar14,uVar12);
    bottom_blob_int8.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_int8.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    bottom_blob_int8.elempack = (int)uVar11;
    bottom_blob_int8.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
    bottom_blob_int8.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    p_Var6 = pp_Var5[-3];
    bottom_blob_int8._28_4_ = uVar11._4_4_;
    copy_make_border(&bottom_blob_unbordered,&local_4d8,
                     *(int *)(p_Var6 + 0xc +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var6 + 0x10 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var6 + 4 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     *(int *)(p_Var6 + 8 +
                             (long)&(this->weight_3x3_winograd43_data).
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),0,
                     *(float *)(p_Var6 + 0x14 +
                               (long)&(this->weight_3x3_winograd43_data).
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>),
                     (Option *)&bottom_blob_int8);
LAB_0012260c:
    if ((local_4d8.data != (void *)0x0) && ((long)local_4d8.c * local_4d8.cstep != 0)) {
LAB_00122635:
      iVar51 = local_4d8.w;
      iVar71 = local_4d8.h;
      goto LAB_00122648;
    }
  }
LAB_00124cf6:
  Mat::~Mat(&local_4d8);
LAB_00124d03:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar66;
}

Assistant:

int Convolution_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (bottom_blob.dims != 3)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    if (kernel_w != kernel_h || stride_w != stride_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    const int kernel_size = kernel_w;
    const int stride = stride_w;  

    if (kernel_size > 7 || stride > 7 || dilation_w != dilation_h)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    typedef void (*conv_func)(const Mat&, Mat&, const Mat&, const Mat&, const Option&);

    // kernel_size x stride
    conv_func conv_func_table[7][4] =
    {
        {
            conv1x1s1_sse,
            conv1x1s2_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_sse,
            conv3x3s2_sse,
            0,
            0
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {
            conv5x5s1_sse,
            conv5x5s2_sse,
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_sse,          
            conv7x7s2_sse,          
            0,
            0
        }  // kernel_size = 7        
    };

    typedef void (*conv_int8_dequant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);
    typedef void (*conv_int8_requant_func)(const Mat&, Mat&, const Mat&, const Mat&, std::vector<float>, const Option&);

    // kernel_size x stride
    conv_int8_dequant_func conv_int8_dequant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_dequant_sse,
            conv1x1s2_int8_dequant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_dequant_sse,
            conv3x3s2_int8_dequant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_dequant_sse,
            conv5x5s2_int8_dequant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_dequant_sse,          
            conv7x7s2_int8_dequant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_int8_requant_func conv_int8_requant_func_table[7][4] =
    {
        {
            conv1x1s1_int8_requant_sse,
            conv1x1s2_int8_requant_sse,
            0,
            0
        }, // kernel_size = 1
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 2
        {
            conv3x3s1_int8_requant_sse,
            conv3x3s2_int8_requant_sse,
            0,
            0,
        }, // kernel_size = 3
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 4
        {        
            conv5x5s1_int8_requant_sse,
            conv5x5s2_int8_requant_sse,    
            0,
            0
        }, // kernel_size = 5
        {
            0,
            0,
            0,
            0
        }, // kernel_size = 6
        {
            conv7x7s1_int8_requant_sse,          
            conv7x7s2_int8_requant_sse, 
            0,
            0
        }  // kernel_size = 7
    };

    conv_func conv = 0;
    conv_int8_dequant_func conv_int8_dequant = 0;
    conv_int8_requant_func conv_int8_requant = 0;

    if (use_int8_inference)
    {
        if (use_int8_requantize)
            conv_int8_requant = conv_int8_requant_func_table[kernel_size-1][stride-1];
        else
            conv_int8_dequant = conv_int8_dequant_func_table[kernel_size-1][stride-1];  
        if ((!conv_int8_requant) && (!conv_int8_dequant))
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }
    }
    else
    {
        conv = conv_func_table[kernel_size-1][stride-1];
        if (!conv)
        {
            return Convolution::forward(bottom_blob, top_blob, opt);
        }

        if (dilation_w != 1)
        {
            if (stride != 1)
                return Convolution::forward(bottom_blob, top_blob, opt);

            return forwardDilation(bottom_blob, top_blob, conv, opt);
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -233 && pad_right == -233 && pad_top == -233 && pad_bottom == -233)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_left == -234 && pad_right == -234 && pad_top == -234 && pad_bottom == -234)
    {
        int wpad = kernel_size + (w - 1) / stride * stride - w;
        int hpad = kernel_size + (h - 1) / stride * stride - h;
        if (wpad > 0 || hpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, BORDER_CONSTANT, pad_value, opt_b);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_size) / stride + 1;
    int outh = (h - kernel_size) / stride + 1;

    // int8
    if (use_int8_inference)
    {         
        if (use_int8_requantize == true)
        {
            Mat top_blob_tm;
            top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
            if (top_blob_tm.empty())
                return -100;
            
            top_blob.create(outw, outh, num_output, (size_t)1u, opt.blob_allocator);
            if (top_blob.empty())
                return -100; 

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data, opt);

                // requantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    requantize_ops[p]->forward(top_blob_tm_g, top_blob_g, opt_g);
                }
            }
            else
                conv_int8_requant(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
        }
        else
        {
            top_blob.create(outw, outh, num_output, (size_t)4u, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            if (use_winograd3x3)
            {
                // conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);
                conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, opt);

                // dequantize, reverse scale inplace
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p=0; p<num_output; p++)
                {
                    Option opt_g = opt;
                    opt_g.num_threads = 1;
                    opt_g.blob_allocator = top_blob.allocator;

                    Mat top_blob_g = top_blob.channel_range(p, 1);
                    dequantize_ops[p]->forward_inplace(top_blob_g, opt_g);
                }
            }
            else
                conv_int8_dequant(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);     
        }

        if (activation)
        {
            activation->forward_inplace(top_blob, opt);
        }        

        return 0;
    }

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;    

    if (use_winograd3x3 && outw >= 8 && outh >=8)
    {
        conv3x3s1_winograd23_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data, bias_data, opt);
//         conv3x3s1_winograd43_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd43_data, bias_data, opt);
    }
    else
        //conv(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);
        conv_im2col_sgemm_sse(bottom_blob_bordered, top_blob, weight_sgemm_data, bias_data, kernel_w, kernel_h, stride_w, stride_h, opt);

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}